

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O0

void __thiscall Maze::pathBetweenCells(Maze *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  ostream *this_00;
  reference local_48;
  __tuple_element_t<1UL,_tuple<int,_int>_> local_38;
  __tuple_element_t<0UL,_tuple<int,_int>_> local_34;
  int topOfStackColumn;
  int topOfStackRow;
  tuple<int,_int> successorIndex;
  int column;
  int row;
  Maze *this_local;
  
  startCellEndCells(this);
  p_Var4 = std::get<0ul,int,int>(&this->startCell);
  iVar1 = *p_Var4;
  p_Var5 = std::get<1ul,int,int>(&this->startCell);
  iVar2 = *p_Var5;
  pvVar6 = std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::at(&this->used,(long)iVar1);
  _successorIndex = std::vector<bool,_std::allocator<bool>_>::at(pvVar6,(long)iVar2);
  std::_Bit_reference::operator=((_Bit_reference *)&successorIndex,true);
  pvVar7 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::at(&this->solvedMatrix,(long)iVar1);
  pvVar8 = std::vector<char,_std::allocator<char>_>::at(pvVar7,(long)iVar2);
  *pvVar8 = ' ';
  std::
  stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
  ::push(&this->pathStack,&this->startCell);
  while( true ) {
    bVar3 = std::
            stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
            ::empty(&this->pathStack);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar9 = std::
             stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
             ::top(&this->pathStack);
    p_Var4 = std::get<0ul,int,int>(pvVar9);
    iVar1 = *p_Var4;
    pvVar9 = std::
             stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
             ::top(&this->pathStack);
    std::get<1ul,int,int>(pvVar9);
    adjacentCells((Maze *)&topOfStackColumn,(int)this,iVar1);
    p_Var4 = std::get<0ul,int,int>((tuple<int,_int> *)&topOfStackColumn);
    iVar1 = *p_Var4;
    p_Var5 = std::get<1ul,int,int>((tuple<int,_int> *)&topOfStackColumn);
    iVar2 = *p_Var5;
    pvVar9 = std::
             stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
             ::top(&this->pathStack);
    p_Var4 = std::get<0ul,int,int>(pvVar9);
    local_34 = *p_Var4;
    pvVar9 = std::
             stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
             ::top(&this->pathStack);
    p_Var5 = std::get<1ul,int,int>(pvVar9);
    local_38 = *p_Var5;
    p_Var4 = std::get<0ul,int,int>((tuple<int,_int> *)&topOfStackColumn);
    if (*p_Var4 == -1) {
      pvVar7 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(&this->solvedMatrix,(long)local_34);
      pvVar8 = std::vector<char,_std::allocator<char>_>::at(pvVar7,(long)local_38);
      *pvVar8 = '0';
      std::
      stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
      ::pop(&this->pathStack);
    }
    else {
      std::
      stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
      ::push(&this->pathStack,(value_type *)&topOfStackColumn);
      pvVar7 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(&this->solvedMatrix,(long)iVar1);
      pvVar8 = std::vector<char,_std::allocator<char>_>::at(pvVar7,(long)iVar2);
      *pvVar8 = ' ';
      pvVar6 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at(&this->used,(long)iVar1);
      local_48 = std::vector<bool,_std::allocator<bool>_>::at(pvVar6,(long)iVar2);
      std::_Bit_reference::operator=(&local_48,true);
    }
    bVar3 = std::
            stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
            ::empty(&this->pathStack);
    if (bVar3) break;
    pvVar9 = std::
             stack<std::tuple<int,_int>,_std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>_>
             ::top(&this->pathStack);
    bVar3 = std::operator==(pvVar9,&this->endCell);
    if (bVar3) {
      this->isSolved = true;
      printSolved(this);
      return;
    }
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Error: their is no path");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Maze::pathBetweenCells() {
    //generates a path between the cells, and shows the path with spaces in the solvedMatrix.
    startCellEndCells();
    int row = std::get<0>(startCell);
    int column = std::get<1>(startCell);
    used.at(row).at(column) = true;
    //MARK START AS SOLVED
    solvedMatrix.at(row).at(column) = ' ';
    pathStack.push(startCell);
    while(!pathStack.empty()){
        auto successorIndex = adjacentCells(std::get<0>(pathStack.top()),std::get<1>(pathStack.top()));
        row = std::get<0>(successorIndex);
        column =std::get<1>(successorIndex);

        int topOfStackRow = std::get<0>(pathStack.top());
        int topOfStackColumn = std::get<1>(pathStack.top());

        if(std::get<0>(successorIndex) == -1){
            //UNMARK CURRENT CELL, as unsolved.
            //BACK TRACK
            solvedMatrix.at(topOfStackRow).at(topOfStackColumn) = '0';
            pathStack.pop();
        }
        else{
            pathStack.push(successorIndex);
            solvedMatrix.at(row).at(column) = ' ';
            used.at(row).at(column) = true;
        }
        if(pathStack.empty()){
            std::cout<<"Error: their is no path"
            <<std::endl;
            break;
        }
        if(pathStack.top() == endCell){
            isSolved = true;
            printSolved();
            break;
        }
    }
}